

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcc_uint.c
# Opt level: O0

qcc_uint qcc_generate_uint(qcc_generator_ptr gen)

{
  qcc_generator_ptr local_28;
  uint64_t res_3;
  uint32_t res_2;
  uint16_t res_1;
  uint8_t res;
  qcc_generator_ptr gen_local;
  
  _res_2 = gen;
  switch(gen->type_size) {
  case 1:
    qcc_generate(gen,(void *)((long)&res_3 + 7));
    gen_local = (qcc_generator_ptr)(ulong)res_3._7_1_;
    break;
  case 2:
    qcc_generate(gen,(void *)((long)&res_3 + 4));
    gen_local = (qcc_generator_ptr)(ulong)res_3._4_2_;
    break;
  default:
    gen_local = (qcc_generator_ptr)0x0;
    break;
  case 4:
    qcc_generate(gen,&res_3);
    gen_local = (qcc_generator_ptr)(ulong)(uint)res_3;
    break;
  case 8:
    qcc_generate(gen,&local_28);
    gen_local = local_28;
  }
  return (qcc_uint)gen_local;
}

Assistant:

qcc_uint qcc_generate_uint(qcc_generator_ptr gen)
{
    switch (gen->type_size)
    {
    case 1:
    {
        uint8_t res;
        qcc_generate(gen, &res);
        return res;
    }
    case 2:
    {
        uint16_t res;
        qcc_generate(gen, &res);
        return res;
    }
    case 4:
    {
        uint32_t res;
        qcc_generate(gen, &res);
        return res;
    }
    case 8:
    {
        uint64_t res;
        qcc_generate(gen, &res);
        return res;
    }
    }
    /* TODO: Raise error */
    return 0;
}